

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

bool slang::ast::formatSpecialArg(char spec,Scope *scope,string *result)

{
  char cVar1;
  int iVar2;
  Symbol *this;
  Symbol *this_00;
  DefinitionSymbol *this_01;
  Scope *in_RSI;
  DefinitionSymbol *def;
  SourceLibrary *lib;
  Symbol *sym;
  string *in_stack_00000238;
  Symbol *in_stack_00000240;
  undefined4 in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  Symbol *in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  cVar1 = charToLower('\0');
  iVar2 = (int)cVar1;
  if (iVar2 == 0x6c) {
    this = Scope::asSymbol(in_RSI);
    this_00 = (Symbol *)Symbol::getSourceLibrary(in_stack_ffffffffffffffd8);
    if (this_00 != (Symbol *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffffd0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar2,in_stack_ffffffffffffffc8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char)((ulong)this_00 >> 0x38));
    }
    this_01 = Symbol::getDeclaringDefinition(this_00);
    if (this_01 == (DefinitionSymbol *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,
                 (char *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    }
    else {
      std::__cxx11::string::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    }
    local_1 = true;
  }
  else if (iVar2 == 0x6d) {
    Scope::asSymbol(in_RSI);
    Symbol::appendHierarchicalPath(in_stack_00000240,in_stack_00000238);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool formatSpecialArg(char spec, const Scope& scope, std::string& result) {
    switch (charToLower(spec)) {
        case 'l': {
            auto& sym = scope.asSymbol();
            if (auto lib = sym.getSourceLibrary()) {
                result += lib->name;
                result.push_back('.');
            }
            if (auto def = sym.getDeclaringDefinition())
                result += def->name;
            else
                result += "$unit";
            return true;
        }
        case 'm':
            scope.asSymbol().appendHierarchicalPath(result);
            return true;
        default:
            return false;
    }
}